

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmintcls.cpp
# Opt level: O0

void __thiscall CVmObjClass::register_meta(CVmObjClass *this,vm_obj_id_t self)

{
  vm_meta_entry_t *pvVar1;
  vm_obj_id_t in_ESI;
  CVmObjClass *in_RDI;
  vm_meta_entry_t *entry;
  
  pvVar1 = get_meta_entry(in_RDI);
  if (pvVar1 != (vm_meta_entry_t *)0x0) {
    pvVar1->class_obj_ = in_ESI;
  }
  return;
}

Assistant:

void CVmObjClass::register_meta(VMG_ vm_obj_id_t self)
{
    /* get my metaclass table entry */
    vm_meta_entry_t *entry = get_meta_entry(vmg0_);

    /* 
     *   if we have a valid entry, store a reference to myself in the
     *   metaclass table - this will let the metaclass that we represent find
     *   us when asked for its class object 
     */
    if (entry != 0)
        entry->class_obj_ = self;
}